

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_test.cc
# Opt level: O3

void __thiscall
CNNTest_TestMultilayerConvolution_Test::TestBody(CNNTest_TestMultilayerConvolution_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  long lVar48;
  undefined8 *puVar49;
  float *pfVar50;
  byte bVar51;
  long lVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar73;
  int iVar75;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  long lVar74;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  long lVar77;
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  int iVar112;
  undefined1 auVar108 [16];
  int iVar113;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  int iVar140;
  int iVar147;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  CNN_THREAD_DATA thread_data;
  float bias [7];
  float expected_valid [28];
  float input [256];
  float expected_replicate [256];
  float expected_same [256];
  float weights [300];
  CNN_THREAD_DATA local_3018;
  float local_3008 [8];
  float local_2fe8 [28];
  CNN_CONFIG local_2f78;
  float local_10e8 [256];
  float local_ce8 [256];
  float local_8e8 [256];
  float local_4e8 [302];
  
  bVar51 = 0;
  memcpy(local_10e8,&DAT_00c0d5f0,0x400);
  memcpy(local_4e8,&DAT_00c0d9f0,0x4b0);
  local_3008[4] = 1.0;
  local_3008[5] = 1.0;
  local_3008[6] = -2.0;
  local_3008[0] = 1.0;
  local_3008[1] = -1.0;
  local_3008[2] = 0.0;
  local_3008[3] = 1.0;
  memcpy(local_8e8,&DAT_00c0dec0,0x400);
  memcpy(local_ce8,&DAT_00c0e2c0,0x400);
  puVar49 = &DAT_00c0e6c0;
  pfVar50 = local_2fe8;
  for (lVar48 = 0xe; lVar48 != 0; lVar48 = lVar48 + -1) {
    *(undefined8 *)pfVar50 = *puVar49;
    puVar49 = puVar49 + (ulong)bVar51 * -2 + 1;
    pfVar50 = pfVar50 + ((ulong)bVar51 * -2 + 1) * 2;
  }
  memset(&local_2f78,0,0x1e90);
  local_2f78.num_layers = 3;
  local_2f78.layer_config[0].in_channels = 1;
  local_2f78.layer_config[0].filter_width = 4;
  local_2f78.layer_config[0].filter_height = 5;
  local_2f78.layer_config[0].out_channels = 3;
  local_2f78.layer_config[0].skip_width = 1;
  local_2f78.layer_config[0].skip_height = 1;
  local_2f78.layer_config[0].activation = '\0';
  local_2f78.layer_config[0].branch_combine_type = '\0';
  local_2f78.layer_config[0].output_num = -1;
  local_2f78.layer_config[1].in_channels = 3;
  local_2f78.layer_config[1].filter_width = 4;
  local_2f78.layer_config[1].filter_height = 5;
  local_2f78.layer_config[1].out_channels = 3;
  local_2f78.layer_config[1].skip_width = 1;
  local_2f78.layer_config[1].skip_height = 1;
  local_2f78.layer_config[1].activation = '\0';
  local_2f78.layer_config[1].branch_combine_type = '\0';
  local_2f78.layer_config[1].output_num = -1;
  local_2f78.layer_config[2].in_channels = 3;
  local_2f78.layer_config[2].filter_width = 4;
  local_2f78.layer_config[2].filter_height = 5;
  local_2f78.layer_config[2].out_channels = 1;
  local_2f78.layer_config[2].skip_width = 1;
  local_2f78.layer_config[2].skip_height = 1;
  local_2f78.layer_config[2].activation = '\0';
  local_2f78.layer_config[2].branch_combine_type = '\0';
  anon_unknown.dwarf_68a17e::CNNTest::AssignLayerWeightsBiases(&local_2f78,local_4e8,local_3008);
  local_3018.num_workers = 1;
  local_3018._4_4_ = 0;
  local_3018.workers = (AVxWorker *)0x0;
  anon_unknown.dwarf_68a17e::CNNTest::RunCNNTest
            (0x10,0x10,local_10e8,local_8e8,&local_2f78,0x10,&local_3018,0.0);
  if (0 < (long)local_2f78.num_layers) {
    lVar48 = (long)local_2f78.num_layers + -1;
    auVar53._8_4_ = (int)lVar48;
    auVar53._0_8_ = lVar48;
    auVar53._12_4_ = (int)((ulong)lVar48 >> 0x20);
    lVar48 = 0;
    auVar54 = auVar53;
    auVar110 = _DAT_00c0d060;
    auVar127 = _DAT_00c0d070;
    auVar79 = _DAT_00c0d080;
    auVar81 = _DAT_00c0d090;
    auVar83 = _DAT_00c0d0a0;
    auVar85 = _DAT_00c0d0b0;
    auVar87 = _DAT_00c0d0c0;
    auVar89 = _DAT_00c0d0d0;
    do {
      auVar108 = auVar53 ^ _DAT_00bfdd80;
      auVar114 = auVar89 ^ _DAT_00bfdd80;
      iVar73 = auVar108._0_4_;
      iVar140 = -(uint)(iVar73 < auVar114._0_4_);
      iVar75 = auVar108._4_4_;
      auVar116._4_4_ = -(uint)(iVar75 < auVar114._4_4_);
      iVar112 = auVar108._8_4_;
      iVar147 = -(uint)(iVar112 < auVar114._8_4_);
      iVar113 = auVar108._12_4_;
      auVar116._12_4_ = -(uint)(iVar113 < auVar114._12_4_);
      auVar108._4_4_ = iVar140;
      auVar108._0_4_ = iVar140;
      auVar108._8_4_ = iVar147;
      auVar108._12_4_ = iVar147;
      auVar108 = pshuflw(auVar54,auVar108,0xe8);
      auVar115._4_4_ = -(uint)(auVar114._4_4_ == iVar75);
      auVar115._12_4_ = -(uint)(auVar114._12_4_ == iVar113);
      auVar115._0_4_ = auVar115._4_4_;
      auVar115._8_4_ = auVar115._12_4_;
      auVar91 = pshuflw(in_XMM11,auVar115,0xe8);
      auVar116._0_4_ = auVar116._4_4_;
      auVar116._8_4_ = auVar116._12_4_;
      auVar114 = pshuflw(auVar108,auVar116,0xe8);
      auVar54._8_4_ = 0xffffffff;
      auVar54._0_8_ = 0xffffffffffffffff;
      auVar54._12_4_ = 0xffffffff;
      auVar54 = (auVar114 | auVar91 & auVar108) ^ auVar54;
      auVar54 = packssdw(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (&local_2f78.layer_config[0].pad)[lVar48] = '\x01';
      }
      auVar91._4_4_ = iVar140;
      auVar91._0_4_ = iVar140;
      auVar91._8_4_ = iVar147;
      auVar91._12_4_ = iVar147;
      auVar116 = auVar115 & auVar91 | auVar116;
      auVar54 = packssdw(auVar116,auVar116);
      auVar114._8_4_ = 0xffffffff;
      auVar114._0_8_ = 0xffffffffffffffff;
      auVar114._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 ^ auVar114,auVar54 ^ auVar114);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._0_4_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1dd0) = 1;
      }
      auVar54 = auVar87 ^ _DAT_00bfdd80;
      auVar92._0_4_ = -(uint)(iVar73 < auVar54._0_4_);
      auVar92._4_4_ = -(uint)(iVar75 < auVar54._4_4_);
      auVar92._8_4_ = -(uint)(iVar112 < auVar54._8_4_);
      auVar92._12_4_ = -(uint)(iVar113 < auVar54._12_4_);
      auVar117._4_4_ = auVar92._0_4_;
      auVar117._0_4_ = auVar92._0_4_;
      auVar117._8_4_ = auVar92._8_4_;
      auVar117._12_4_ = auVar92._8_4_;
      iVar140 = -(uint)(auVar54._4_4_ == iVar75);
      iVar147 = -(uint)(auVar54._12_4_ == iVar113);
      auVar20._4_4_ = iVar140;
      auVar20._0_4_ = iVar140;
      auVar20._8_4_ = iVar147;
      auVar20._12_4_ = iVar147;
      auVar141._4_4_ = auVar92._4_4_;
      auVar141._0_4_ = auVar92._4_4_;
      auVar141._8_4_ = auVar92._12_4_;
      auVar141._12_4_ = auVar92._12_4_;
      auVar54 = auVar20 & auVar117 | auVar141;
      auVar54 = packssdw(auVar54,auVar54);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 ^ auVar1,auVar54 ^ auVar1);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._0_4_ >> 0x10 & 1) != 0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1d58) = 1;
      }
      auVar54 = pshufhw(auVar54,auVar117,0x84);
      auVar21._4_4_ = iVar140;
      auVar21._0_4_ = iVar140;
      auVar21._8_4_ = iVar147;
      auVar21._12_4_ = iVar147;
      auVar114 = pshufhw(auVar92,auVar21,0x84);
      auVar108 = pshufhw(auVar54,auVar141,0x84);
      auVar55._8_4_ = 0xffffffff;
      auVar55._0_8_ = 0xffffffffffffffff;
      auVar55._12_4_ = 0xffffffff;
      auVar55 = (auVar108 | auVar114 & auVar54) ^ auVar55;
      auVar54 = packssdw(auVar55,auVar55);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._0_4_ >> 0x18 & 1) != 0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1ce0) = 1;
      }
      auVar54 = auVar85 ^ _DAT_00bfdd80;
      auVar93._0_4_ = -(uint)(iVar73 < auVar54._0_4_);
      auVar93._4_4_ = -(uint)(iVar75 < auVar54._4_4_);
      auVar93._8_4_ = -(uint)(iVar112 < auVar54._8_4_);
      auVar93._12_4_ = -(uint)(iVar113 < auVar54._12_4_);
      auVar22._4_4_ = auVar93._0_4_;
      auVar22._0_4_ = auVar93._0_4_;
      auVar22._8_4_ = auVar93._8_4_;
      auVar22._12_4_ = auVar93._8_4_;
      auVar114 = pshuflw(auVar141,auVar22,0xe8);
      auVar56._0_4_ = -(uint)(auVar54._0_4_ == iVar73);
      auVar56._4_4_ = -(uint)(auVar54._4_4_ == iVar75);
      auVar56._8_4_ = -(uint)(auVar54._8_4_ == iVar112);
      auVar56._12_4_ = -(uint)(auVar54._12_4_ == iVar113);
      auVar118._4_4_ = auVar56._4_4_;
      auVar118._0_4_ = auVar56._4_4_;
      auVar118._8_4_ = auVar56._12_4_;
      auVar118._12_4_ = auVar56._12_4_;
      auVar54 = pshuflw(auVar56,auVar118,0xe8);
      auVar119._4_4_ = auVar93._4_4_;
      auVar119._0_4_ = auVar93._4_4_;
      auVar119._8_4_ = auVar93._12_4_;
      auVar119._12_4_ = auVar93._12_4_;
      auVar108 = pshuflw(auVar93,auVar119,0xe8);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 & auVar114,(auVar108 | auVar54 & auVar114) ^ auVar2);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1c68) = 1;
      }
      auVar23._4_4_ = auVar93._0_4_;
      auVar23._0_4_ = auVar93._0_4_;
      auVar23._8_4_ = auVar93._8_4_;
      auVar23._12_4_ = auVar93._8_4_;
      auVar119 = auVar118 & auVar23 | auVar119;
      auVar108 = packssdw(auVar119,auVar119);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54,auVar108 ^ auVar3);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._4_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1bf0) = 1;
      }
      auVar54 = auVar83 ^ _DAT_00bfdd80;
      auVar94._0_4_ = -(uint)(iVar73 < auVar54._0_4_);
      auVar94._4_4_ = -(uint)(iVar75 < auVar54._4_4_);
      auVar94._8_4_ = -(uint)(iVar112 < auVar54._8_4_);
      auVar94._12_4_ = -(uint)(iVar113 < auVar54._12_4_);
      auVar120._4_4_ = auVar94._0_4_;
      auVar120._0_4_ = auVar94._0_4_;
      auVar120._8_4_ = auVar94._8_4_;
      auVar120._12_4_ = auVar94._8_4_;
      iVar140 = -(uint)(auVar54._4_4_ == iVar75);
      iVar147 = -(uint)(auVar54._12_4_ == iVar113);
      auVar24._4_4_ = iVar140;
      auVar24._0_4_ = iVar140;
      auVar24._8_4_ = iVar147;
      auVar24._12_4_ = iVar147;
      auVar142._4_4_ = auVar94._4_4_;
      auVar142._0_4_ = auVar94._4_4_;
      auVar142._8_4_ = auVar94._12_4_;
      auVar142._12_4_ = auVar94._12_4_;
      auVar54 = auVar24 & auVar120 | auVar142;
      auVar54 = packssdw(auVar54,auVar54);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 ^ auVar4,auVar54 ^ auVar4);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1b78) = 1;
      }
      auVar54 = pshufhw(auVar54,auVar120,0x84);
      auVar25._4_4_ = iVar140;
      auVar25._0_4_ = iVar140;
      auVar25._8_4_ = iVar147;
      auVar25._12_4_ = iVar147;
      auVar114 = pshufhw(auVar94,auVar25,0x84);
      auVar108 = pshufhw(auVar54,auVar142,0x84);
      auVar57._8_4_ = 0xffffffff;
      auVar57._0_8_ = 0xffffffffffffffff;
      auVar57._12_4_ = 0xffffffff;
      auVar57 = (auVar108 | auVar114 & auVar54) ^ auVar57;
      auVar54 = packssdw(auVar57,auVar57);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._6_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1b00) = 1;
      }
      auVar54 = auVar81 ^ _DAT_00bfdd80;
      auVar95._0_4_ = -(uint)(iVar73 < auVar54._0_4_);
      auVar95._4_4_ = -(uint)(iVar75 < auVar54._4_4_);
      auVar95._8_4_ = -(uint)(iVar112 < auVar54._8_4_);
      auVar95._12_4_ = -(uint)(iVar113 < auVar54._12_4_);
      auVar26._4_4_ = auVar95._0_4_;
      auVar26._0_4_ = auVar95._0_4_;
      auVar26._8_4_ = auVar95._8_4_;
      auVar26._12_4_ = auVar95._8_4_;
      auVar114 = pshuflw(auVar142,auVar26,0xe8);
      auVar58._0_4_ = -(uint)(auVar54._0_4_ == iVar73);
      auVar58._4_4_ = -(uint)(auVar54._4_4_ == iVar75);
      auVar58._8_4_ = -(uint)(auVar54._8_4_ == iVar112);
      auVar58._12_4_ = -(uint)(auVar54._12_4_ == iVar113);
      auVar121._4_4_ = auVar58._4_4_;
      auVar121._0_4_ = auVar58._4_4_;
      auVar121._8_4_ = auVar58._12_4_;
      auVar121._12_4_ = auVar58._12_4_;
      auVar54 = pshuflw(auVar58,auVar121,0xe8);
      auVar122._4_4_ = auVar95._4_4_;
      auVar122._0_4_ = auVar95._4_4_;
      auVar122._8_4_ = auVar95._12_4_;
      auVar122._12_4_ = auVar95._12_4_;
      auVar108 = pshuflw(auVar95,auVar122,0xe8);
      auVar96._8_4_ = 0xffffffff;
      auVar96._0_8_ = 0xffffffffffffffff;
      auVar96._12_4_ = 0xffffffff;
      auVar96 = (auVar108 | auVar54 & auVar114) ^ auVar96;
      auVar108 = packssdw(auVar96,auVar96);
      auVar54 = packsswb(auVar54 & auVar114,auVar108);
      if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1a88) = 1;
      }
      auVar27._4_4_ = auVar95._0_4_;
      auVar27._0_4_ = auVar95._0_4_;
      auVar27._8_4_ = auVar95._8_4_;
      auVar27._12_4_ = auVar95._8_4_;
      auVar122 = auVar121 & auVar27 | auVar122;
      auVar108 = packssdw(auVar122,auVar122);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar108 = packssdw(auVar108 ^ auVar5,auVar108 ^ auVar5);
      auVar54 = packsswb(auVar54,auVar108);
      if ((auVar54._8_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1a10) = 1;
      }
      auVar54 = auVar79 ^ _DAT_00bfdd80;
      auVar97._0_4_ = -(uint)(iVar73 < auVar54._0_4_);
      auVar97._4_4_ = -(uint)(iVar75 < auVar54._4_4_);
      auVar97._8_4_ = -(uint)(iVar112 < auVar54._8_4_);
      auVar97._12_4_ = -(uint)(iVar113 < auVar54._12_4_);
      auVar123._4_4_ = auVar97._0_4_;
      auVar123._0_4_ = auVar97._0_4_;
      auVar123._8_4_ = auVar97._8_4_;
      auVar123._12_4_ = auVar97._8_4_;
      iVar140 = -(uint)(auVar54._4_4_ == iVar75);
      iVar147 = -(uint)(auVar54._12_4_ == iVar113);
      auVar28._4_4_ = iVar140;
      auVar28._0_4_ = iVar140;
      auVar28._8_4_ = iVar147;
      auVar28._12_4_ = iVar147;
      auVar143._4_4_ = auVar97._4_4_;
      auVar143._0_4_ = auVar97._4_4_;
      auVar143._8_4_ = auVar97._12_4_;
      auVar143._12_4_ = auVar97._12_4_;
      auVar54 = auVar28 & auVar123 | auVar143;
      auVar54 = packssdw(auVar54,auVar54);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 ^ auVar6,auVar54 ^ auVar6);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1998) = 1;
      }
      auVar54 = pshufhw(auVar54,auVar123,0x84);
      auVar29._4_4_ = iVar140;
      auVar29._0_4_ = iVar140;
      auVar29._8_4_ = iVar147;
      auVar29._12_4_ = iVar147;
      auVar114 = pshufhw(auVar97,auVar29,0x84);
      auVar108 = pshufhw(auVar54,auVar143,0x84);
      auVar59._8_4_ = 0xffffffff;
      auVar59._0_8_ = 0xffffffffffffffff;
      auVar59._12_4_ = 0xffffffff;
      auVar59 = (auVar108 | auVar114 & auVar54) ^ auVar59;
      auVar54 = packssdw(auVar59,auVar59);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._10_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1920) = 1;
      }
      auVar54 = auVar127 ^ _DAT_00bfdd80;
      auVar98._0_4_ = -(uint)(iVar73 < auVar54._0_4_);
      auVar98._4_4_ = -(uint)(iVar75 < auVar54._4_4_);
      auVar98._8_4_ = -(uint)(iVar112 < auVar54._8_4_);
      auVar98._12_4_ = -(uint)(iVar113 < auVar54._12_4_);
      auVar30._4_4_ = auVar98._0_4_;
      auVar30._0_4_ = auVar98._0_4_;
      auVar30._8_4_ = auVar98._8_4_;
      auVar30._12_4_ = auVar98._8_4_;
      auVar114 = pshuflw(auVar143,auVar30,0xe8);
      auVar60._0_4_ = -(uint)(auVar54._0_4_ == iVar73);
      auVar60._4_4_ = -(uint)(auVar54._4_4_ == iVar75);
      auVar60._8_4_ = -(uint)(auVar54._8_4_ == iVar112);
      auVar60._12_4_ = -(uint)(auVar54._12_4_ == iVar113);
      auVar124._4_4_ = auVar60._4_4_;
      auVar124._0_4_ = auVar60._4_4_;
      auVar124._8_4_ = auVar60._12_4_;
      auVar124._12_4_ = auVar60._12_4_;
      auVar54 = pshuflw(auVar60,auVar124,0xe8);
      auVar125._4_4_ = auVar98._4_4_;
      auVar125._0_4_ = auVar98._4_4_;
      auVar125._8_4_ = auVar98._12_4_;
      auVar125._12_4_ = auVar98._12_4_;
      auVar108 = pshuflw(auVar98,auVar125,0xe8);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 & auVar114,(auVar108 | auVar54 & auVar114) ^ auVar7);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x18a8) = 1;
      }
      auVar31._4_4_ = auVar98._0_4_;
      auVar31._0_4_ = auVar98._0_4_;
      auVar31._8_4_ = auVar98._8_4_;
      auVar31._12_4_ = auVar98._8_4_;
      auVar125 = auVar124 & auVar31 | auVar125;
      auVar108 = packssdw(auVar125,auVar125);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54,auVar108 ^ auVar8);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._12_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1830) = 1;
      }
      auVar54 = auVar110 ^ _DAT_00bfdd80;
      auVar99._0_4_ = -(uint)(iVar73 < auVar54._0_4_);
      auVar99._4_4_ = -(uint)(iVar75 < auVar54._4_4_);
      auVar99._8_4_ = -(uint)(iVar112 < auVar54._8_4_);
      auVar99._12_4_ = -(uint)(iVar113 < auVar54._12_4_);
      auVar126._4_4_ = auVar99._0_4_;
      auVar126._0_4_ = auVar99._0_4_;
      auVar126._8_4_ = auVar99._8_4_;
      auVar126._12_4_ = auVar99._8_4_;
      iVar73 = -(uint)(auVar54._4_4_ == iVar75);
      iVar75 = -(uint)(auVar54._12_4_ == iVar113);
      auVar109._4_4_ = iVar73;
      auVar109._0_4_ = iVar73;
      auVar109._8_4_ = iVar75;
      auVar109._12_4_ = iVar75;
      auVar61._4_4_ = auVar99._4_4_;
      auVar61._0_4_ = auVar99._4_4_;
      auVar61._8_4_ = auVar99._12_4_;
      auVar61._12_4_ = auVar99._12_4_;
      auVar61 = auVar109 & auVar126 | auVar61;
      auVar54 = packssdw(auVar61,auVar61);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 ^ auVar9,auVar54 ^ auVar9);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x17b8) = 1;
      }
      auVar54 = pshufhw(auVar54,auVar126,0x84);
      in_XMM11 = pshufhw(auVar99,auVar109,0x84);
      in_XMM11 = in_XMM11 & auVar54;
      auVar32._4_4_ = auVar99._4_4_;
      auVar32._0_4_ = auVar99._4_4_;
      auVar32._8_4_ = auVar99._12_4_;
      auVar32._12_4_ = auVar99._12_4_;
      auVar54 = pshufhw(auVar54,auVar32,0x84);
      auVar62._8_4_ = 0xffffffff;
      auVar62._0_8_ = 0xffffffffffffffff;
      auVar62._12_4_ = 0xffffffff;
      auVar62 = (auVar54 | in_XMM11) ^ auVar62;
      auVar54 = packssdw(auVar62,auVar62);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._14_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1740) = 1;
      }
      lVar52 = (long)DAT_00c0d0e0;
      lVar77 = auVar89._8_8_;
      auVar89._0_8_ = auVar89._0_8_ + lVar52;
      lVar74 = DAT_00c0d0e0._8_8_;
      auVar89._8_8_ = lVar77 + lVar74;
      lVar77 = auVar87._8_8_;
      auVar87._0_8_ = auVar87._0_8_ + lVar52;
      auVar87._8_8_ = lVar77 + lVar74;
      lVar77 = auVar85._8_8_;
      auVar85._0_8_ = auVar85._0_8_ + lVar52;
      auVar85._8_8_ = lVar77 + lVar74;
      lVar77 = auVar83._8_8_;
      auVar83._0_8_ = auVar83._0_8_ + lVar52;
      auVar83._8_8_ = lVar77 + lVar74;
      lVar77 = auVar81._8_8_;
      auVar81._0_8_ = auVar81._0_8_ + lVar52;
      auVar81._8_8_ = lVar77 + lVar74;
      lVar77 = auVar79._8_8_;
      auVar79._0_8_ = auVar79._0_8_ + lVar52;
      auVar79._8_8_ = lVar77 + lVar74;
      lVar77 = auVar127._8_8_;
      auVar127._0_8_ = auVar127._0_8_ + lVar52;
      auVar127._8_8_ = lVar77 + lVar74;
      lVar77 = auVar110._8_8_;
      auVar110._0_8_ = auVar110._0_8_ + lVar52;
      auVar110._8_8_ = lVar77 + lVar74;
      lVar48 = lVar48 + 0x780;
      auVar54 = _DAT_00c0d0e0;
    } while ((ulong)(local_2f78.num_layers + 0xfU >> 4) * 0x780 - lVar48 != 0);
  }
  anon_unknown.dwarf_68a17e::CNNTest::RunCNNTest
            (0x10,0x10,local_10e8,local_ce8,&local_2f78,0x10,&local_3018,0.0);
  if (0 < (long)local_2f78.num_layers) {
    lVar48 = (long)local_2f78.num_layers + -1;
    auVar63._8_4_ = (int)lVar48;
    auVar63._0_8_ = lVar48;
    auVar63._12_4_ = (int)((ulong)lVar48 >> 0x20);
    lVar48 = 0;
    auVar54 = auVar63;
    auVar76 = _DAT_00c0d060;
    auVar78 = _DAT_00c0d070;
    auVar80 = _DAT_00c0d080;
    auVar82 = _DAT_00c0d090;
    auVar84 = _DAT_00c0d0a0;
    auVar86 = _DAT_00c0d0b0;
    auVar88 = _DAT_00c0d0c0;
    auVar90 = _DAT_00c0d0d0;
    do {
      auVar110 = auVar63 ^ _DAT_00bfdd80;
      auVar127 = auVar90 ^ _DAT_00bfdd80;
      iVar73 = auVar110._0_4_;
      iVar140 = -(uint)(iVar73 < auVar127._0_4_);
      iVar75 = auVar110._4_4_;
      auVar129._4_4_ = -(uint)(iVar75 < auVar127._4_4_);
      iVar112 = auVar110._8_4_;
      iVar147 = -(uint)(iVar112 < auVar127._8_4_);
      iVar113 = auVar110._12_4_;
      auVar129._12_4_ = -(uint)(iVar113 < auVar127._12_4_);
      auVar33._4_4_ = iVar140;
      auVar33._0_4_ = iVar140;
      auVar33._8_4_ = iVar147;
      auVar33._12_4_ = iVar147;
      auVar54 = pshuflw(auVar54,auVar33,0xe8);
      auVar128._4_4_ = -(uint)(auVar127._4_4_ == iVar75);
      auVar128._12_4_ = -(uint)(auVar127._12_4_ == iVar113);
      auVar128._0_4_ = auVar128._4_4_;
      auVar128._8_4_ = auVar128._12_4_;
      auVar127 = pshuflw(in_XMM11,auVar128,0xe8);
      auVar129._0_4_ = auVar129._4_4_;
      auVar129._8_4_ = auVar129._12_4_;
      auVar110 = pshuflw(auVar54,auVar129,0xe8);
      auVar64._8_4_ = 0xffffffff;
      auVar64._0_8_ = 0xffffffffffffffff;
      auVar64._12_4_ = 0xffffffff;
      auVar64 = (auVar110 | auVar127 & auVar54) ^ auVar64;
      auVar54 = packssdw(auVar64,auVar64);
      if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (&local_2f78.layer_config[0].pad)[lVar48] = '\x02';
      }
      auVar34._4_4_ = iVar140;
      auVar34._0_4_ = iVar140;
      auVar34._8_4_ = iVar147;
      auVar34._12_4_ = iVar147;
      auVar129 = auVar128 & auVar34 | auVar129;
      auVar54 = packssdw(auVar129,auVar129);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 ^ auVar10,auVar54 ^ auVar10);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._0_4_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1dd0) = 2;
      }
      auVar54 = auVar88 ^ _DAT_00bfdd80;
      auVar100._0_4_ = -(uint)(iVar73 < auVar54._0_4_);
      auVar100._4_4_ = -(uint)(iVar75 < auVar54._4_4_);
      auVar100._8_4_ = -(uint)(iVar112 < auVar54._8_4_);
      auVar100._12_4_ = -(uint)(iVar113 < auVar54._12_4_);
      auVar130._4_4_ = auVar100._0_4_;
      auVar130._0_4_ = auVar100._0_4_;
      auVar130._8_4_ = auVar100._8_4_;
      auVar130._12_4_ = auVar100._8_4_;
      iVar140 = -(uint)(auVar54._4_4_ == iVar75);
      iVar147 = -(uint)(auVar54._12_4_ == iVar113);
      auVar35._4_4_ = iVar140;
      auVar35._0_4_ = iVar140;
      auVar35._8_4_ = iVar147;
      auVar35._12_4_ = iVar147;
      auVar144._4_4_ = auVar100._4_4_;
      auVar144._0_4_ = auVar100._4_4_;
      auVar144._8_4_ = auVar100._12_4_;
      auVar144._12_4_ = auVar100._12_4_;
      auVar54 = auVar35 & auVar130 | auVar144;
      auVar54 = packssdw(auVar54,auVar54);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 ^ auVar11,auVar54 ^ auVar11);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._0_4_ >> 0x10 & 1) != 0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1d58) = 2;
      }
      auVar54 = pshufhw(auVar54,auVar130,0x84);
      auVar36._4_4_ = iVar140;
      auVar36._0_4_ = iVar140;
      auVar36._8_4_ = iVar147;
      auVar36._12_4_ = iVar147;
      auVar127 = pshufhw(auVar100,auVar36,0x84);
      auVar110 = pshufhw(auVar54,auVar144,0x84);
      auVar65._8_4_ = 0xffffffff;
      auVar65._0_8_ = 0xffffffffffffffff;
      auVar65._12_4_ = 0xffffffff;
      auVar65 = (auVar110 | auVar127 & auVar54) ^ auVar65;
      auVar54 = packssdw(auVar65,auVar65);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._0_4_ >> 0x18 & 1) != 0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1ce0) = 2;
      }
      auVar54 = auVar86 ^ _DAT_00bfdd80;
      auVar101._0_4_ = -(uint)(iVar73 < auVar54._0_4_);
      auVar101._4_4_ = -(uint)(iVar75 < auVar54._4_4_);
      auVar101._8_4_ = -(uint)(iVar112 < auVar54._8_4_);
      auVar101._12_4_ = -(uint)(iVar113 < auVar54._12_4_);
      auVar37._4_4_ = auVar101._0_4_;
      auVar37._0_4_ = auVar101._0_4_;
      auVar37._8_4_ = auVar101._8_4_;
      auVar37._12_4_ = auVar101._8_4_;
      auVar127 = pshuflw(auVar144,auVar37,0xe8);
      auVar66._0_4_ = -(uint)(auVar54._0_4_ == iVar73);
      auVar66._4_4_ = -(uint)(auVar54._4_4_ == iVar75);
      auVar66._8_4_ = -(uint)(auVar54._8_4_ == iVar112);
      auVar66._12_4_ = -(uint)(auVar54._12_4_ == iVar113);
      auVar131._4_4_ = auVar66._4_4_;
      auVar131._0_4_ = auVar66._4_4_;
      auVar131._8_4_ = auVar66._12_4_;
      auVar131._12_4_ = auVar66._12_4_;
      auVar54 = pshuflw(auVar66,auVar131,0xe8);
      auVar132._4_4_ = auVar101._4_4_;
      auVar132._0_4_ = auVar101._4_4_;
      auVar132._8_4_ = auVar101._12_4_;
      auVar132._12_4_ = auVar101._12_4_;
      auVar110 = pshuflw(auVar101,auVar132,0xe8);
      auVar12._8_4_ = 0xffffffff;
      auVar12._0_8_ = 0xffffffffffffffff;
      auVar12._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 & auVar127,(auVar110 | auVar54 & auVar127) ^ auVar12);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1c68) = 2;
      }
      auVar38._4_4_ = auVar101._0_4_;
      auVar38._0_4_ = auVar101._0_4_;
      auVar38._8_4_ = auVar101._8_4_;
      auVar38._12_4_ = auVar101._8_4_;
      auVar132 = auVar131 & auVar38 | auVar132;
      auVar110 = packssdw(auVar132,auVar132);
      auVar13._8_4_ = 0xffffffff;
      auVar13._0_8_ = 0xffffffffffffffff;
      auVar13._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54,auVar110 ^ auVar13);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._4_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1bf0) = 2;
      }
      auVar54 = auVar84 ^ _DAT_00bfdd80;
      auVar102._0_4_ = -(uint)(iVar73 < auVar54._0_4_);
      auVar102._4_4_ = -(uint)(iVar75 < auVar54._4_4_);
      auVar102._8_4_ = -(uint)(iVar112 < auVar54._8_4_);
      auVar102._12_4_ = -(uint)(iVar113 < auVar54._12_4_);
      auVar133._4_4_ = auVar102._0_4_;
      auVar133._0_4_ = auVar102._0_4_;
      auVar133._8_4_ = auVar102._8_4_;
      auVar133._12_4_ = auVar102._8_4_;
      iVar140 = -(uint)(auVar54._4_4_ == iVar75);
      iVar147 = -(uint)(auVar54._12_4_ == iVar113);
      auVar39._4_4_ = iVar140;
      auVar39._0_4_ = iVar140;
      auVar39._8_4_ = iVar147;
      auVar39._12_4_ = iVar147;
      auVar145._4_4_ = auVar102._4_4_;
      auVar145._0_4_ = auVar102._4_4_;
      auVar145._8_4_ = auVar102._12_4_;
      auVar145._12_4_ = auVar102._12_4_;
      auVar54 = auVar39 & auVar133 | auVar145;
      auVar54 = packssdw(auVar54,auVar54);
      auVar14._8_4_ = 0xffffffff;
      auVar14._0_8_ = 0xffffffffffffffff;
      auVar14._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 ^ auVar14,auVar54 ^ auVar14);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1b78) = 2;
      }
      auVar54 = pshufhw(auVar54,auVar133,0x84);
      auVar40._4_4_ = iVar140;
      auVar40._0_4_ = iVar140;
      auVar40._8_4_ = iVar147;
      auVar40._12_4_ = iVar147;
      auVar127 = pshufhw(auVar102,auVar40,0x84);
      auVar110 = pshufhw(auVar54,auVar145,0x84);
      auVar67._8_4_ = 0xffffffff;
      auVar67._0_8_ = 0xffffffffffffffff;
      auVar67._12_4_ = 0xffffffff;
      auVar67 = (auVar110 | auVar127 & auVar54) ^ auVar67;
      auVar54 = packssdw(auVar67,auVar67);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._6_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1b00) = 2;
      }
      auVar54 = auVar82 ^ _DAT_00bfdd80;
      auVar103._0_4_ = -(uint)(iVar73 < auVar54._0_4_);
      auVar103._4_4_ = -(uint)(iVar75 < auVar54._4_4_);
      auVar103._8_4_ = -(uint)(iVar112 < auVar54._8_4_);
      auVar103._12_4_ = -(uint)(iVar113 < auVar54._12_4_);
      auVar41._4_4_ = auVar103._0_4_;
      auVar41._0_4_ = auVar103._0_4_;
      auVar41._8_4_ = auVar103._8_4_;
      auVar41._12_4_ = auVar103._8_4_;
      auVar127 = pshuflw(auVar145,auVar41,0xe8);
      auVar68._0_4_ = -(uint)(auVar54._0_4_ == iVar73);
      auVar68._4_4_ = -(uint)(auVar54._4_4_ == iVar75);
      auVar68._8_4_ = -(uint)(auVar54._8_4_ == iVar112);
      auVar68._12_4_ = -(uint)(auVar54._12_4_ == iVar113);
      auVar134._4_4_ = auVar68._4_4_;
      auVar134._0_4_ = auVar68._4_4_;
      auVar134._8_4_ = auVar68._12_4_;
      auVar134._12_4_ = auVar68._12_4_;
      auVar54 = pshuflw(auVar68,auVar134,0xe8);
      auVar135._4_4_ = auVar103._4_4_;
      auVar135._0_4_ = auVar103._4_4_;
      auVar135._8_4_ = auVar103._12_4_;
      auVar135._12_4_ = auVar103._12_4_;
      auVar110 = pshuflw(auVar103,auVar135,0xe8);
      auVar104._8_4_ = 0xffffffff;
      auVar104._0_8_ = 0xffffffffffffffff;
      auVar104._12_4_ = 0xffffffff;
      auVar104 = (auVar110 | auVar54 & auVar127) ^ auVar104;
      auVar110 = packssdw(auVar104,auVar104);
      auVar54 = packsswb(auVar54 & auVar127,auVar110);
      if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1a88) = 2;
      }
      auVar42._4_4_ = auVar103._0_4_;
      auVar42._0_4_ = auVar103._0_4_;
      auVar42._8_4_ = auVar103._8_4_;
      auVar42._12_4_ = auVar103._8_4_;
      auVar135 = auVar134 & auVar42 | auVar135;
      auVar110 = packssdw(auVar135,auVar135);
      auVar15._8_4_ = 0xffffffff;
      auVar15._0_8_ = 0xffffffffffffffff;
      auVar15._12_4_ = 0xffffffff;
      auVar110 = packssdw(auVar110 ^ auVar15,auVar110 ^ auVar15);
      auVar54 = packsswb(auVar54,auVar110);
      if ((auVar54._8_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1a10) = 2;
      }
      auVar54 = auVar80 ^ _DAT_00bfdd80;
      auVar105._0_4_ = -(uint)(iVar73 < auVar54._0_4_);
      auVar105._4_4_ = -(uint)(iVar75 < auVar54._4_4_);
      auVar105._8_4_ = -(uint)(iVar112 < auVar54._8_4_);
      auVar105._12_4_ = -(uint)(iVar113 < auVar54._12_4_);
      auVar136._4_4_ = auVar105._0_4_;
      auVar136._0_4_ = auVar105._0_4_;
      auVar136._8_4_ = auVar105._8_4_;
      auVar136._12_4_ = auVar105._8_4_;
      iVar140 = -(uint)(auVar54._4_4_ == iVar75);
      iVar147 = -(uint)(auVar54._12_4_ == iVar113);
      auVar43._4_4_ = iVar140;
      auVar43._0_4_ = iVar140;
      auVar43._8_4_ = iVar147;
      auVar43._12_4_ = iVar147;
      auVar146._4_4_ = auVar105._4_4_;
      auVar146._0_4_ = auVar105._4_4_;
      auVar146._8_4_ = auVar105._12_4_;
      auVar146._12_4_ = auVar105._12_4_;
      auVar54 = auVar43 & auVar136 | auVar146;
      auVar54 = packssdw(auVar54,auVar54);
      auVar16._8_4_ = 0xffffffff;
      auVar16._0_8_ = 0xffffffffffffffff;
      auVar16._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 ^ auVar16,auVar54 ^ auVar16);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1998) = 2;
      }
      auVar54 = pshufhw(auVar54,auVar136,0x84);
      auVar44._4_4_ = iVar140;
      auVar44._0_4_ = iVar140;
      auVar44._8_4_ = iVar147;
      auVar44._12_4_ = iVar147;
      auVar127 = pshufhw(auVar105,auVar44,0x84);
      auVar110 = pshufhw(auVar54,auVar146,0x84);
      auVar69._8_4_ = 0xffffffff;
      auVar69._0_8_ = 0xffffffffffffffff;
      auVar69._12_4_ = 0xffffffff;
      auVar69 = (auVar110 | auVar127 & auVar54) ^ auVar69;
      auVar54 = packssdw(auVar69,auVar69);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._10_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1920) = 2;
      }
      auVar54 = auVar78 ^ _DAT_00bfdd80;
      auVar106._0_4_ = -(uint)(iVar73 < auVar54._0_4_);
      auVar106._4_4_ = -(uint)(iVar75 < auVar54._4_4_);
      auVar106._8_4_ = -(uint)(iVar112 < auVar54._8_4_);
      auVar106._12_4_ = -(uint)(iVar113 < auVar54._12_4_);
      auVar45._4_4_ = auVar106._0_4_;
      auVar45._0_4_ = auVar106._0_4_;
      auVar45._8_4_ = auVar106._8_4_;
      auVar45._12_4_ = auVar106._8_4_;
      auVar127 = pshuflw(auVar146,auVar45,0xe8);
      auVar70._0_4_ = -(uint)(auVar54._0_4_ == iVar73);
      auVar70._4_4_ = -(uint)(auVar54._4_4_ == iVar75);
      auVar70._8_4_ = -(uint)(auVar54._8_4_ == iVar112);
      auVar70._12_4_ = -(uint)(auVar54._12_4_ == iVar113);
      auVar137._4_4_ = auVar70._4_4_;
      auVar137._0_4_ = auVar70._4_4_;
      auVar137._8_4_ = auVar70._12_4_;
      auVar137._12_4_ = auVar70._12_4_;
      auVar54 = pshuflw(auVar70,auVar137,0xe8);
      auVar138._4_4_ = auVar106._4_4_;
      auVar138._0_4_ = auVar106._4_4_;
      auVar138._8_4_ = auVar106._12_4_;
      auVar138._12_4_ = auVar106._12_4_;
      auVar110 = pshuflw(auVar106,auVar138,0xe8);
      auVar17._8_4_ = 0xffffffff;
      auVar17._0_8_ = 0xffffffffffffffff;
      auVar17._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 & auVar127,(auVar110 | auVar54 & auVar127) ^ auVar17);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x18a8) = 2;
      }
      auVar46._4_4_ = auVar106._0_4_;
      auVar46._0_4_ = auVar106._0_4_;
      auVar46._8_4_ = auVar106._8_4_;
      auVar46._12_4_ = auVar106._8_4_;
      auVar138 = auVar137 & auVar46 | auVar138;
      auVar110 = packssdw(auVar138,auVar138);
      auVar18._8_4_ = 0xffffffff;
      auVar18._0_8_ = 0xffffffffffffffff;
      auVar18._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54,auVar110 ^ auVar18);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._12_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1830) = 2;
      }
      auVar54 = auVar76 ^ _DAT_00bfdd80;
      auVar107._0_4_ = -(uint)(iVar73 < auVar54._0_4_);
      auVar107._4_4_ = -(uint)(iVar75 < auVar54._4_4_);
      auVar107._8_4_ = -(uint)(iVar112 < auVar54._8_4_);
      auVar107._12_4_ = -(uint)(iVar113 < auVar54._12_4_);
      auVar139._4_4_ = auVar107._0_4_;
      auVar139._0_4_ = auVar107._0_4_;
      auVar139._8_4_ = auVar107._8_4_;
      auVar139._12_4_ = auVar107._8_4_;
      iVar73 = -(uint)(auVar54._4_4_ == iVar75);
      iVar75 = -(uint)(auVar54._12_4_ == iVar113);
      auVar111._4_4_ = iVar73;
      auVar111._0_4_ = iVar73;
      auVar111._8_4_ = iVar75;
      auVar111._12_4_ = iVar75;
      auVar71._4_4_ = auVar107._4_4_;
      auVar71._0_4_ = auVar107._4_4_;
      auVar71._8_4_ = auVar107._12_4_;
      auVar71._12_4_ = auVar107._12_4_;
      auVar71 = auVar111 & auVar139 | auVar71;
      auVar54 = packssdw(auVar71,auVar71);
      auVar19._8_4_ = 0xffffffff;
      auVar19._0_8_ = 0xffffffffffffffff;
      auVar19._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 ^ auVar19,auVar54 ^ auVar19);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x17b8) = 2;
      }
      auVar54 = pshufhw(auVar54,auVar139,0x84);
      in_XMM11 = pshufhw(auVar107,auVar111,0x84);
      in_XMM11 = in_XMM11 & auVar54;
      auVar47._4_4_ = auVar107._4_4_;
      auVar47._0_4_ = auVar107._4_4_;
      auVar47._8_4_ = auVar107._12_4_;
      auVar47._12_4_ = auVar107._12_4_;
      auVar54 = pshufhw(auVar54,auVar47,0x84);
      auVar72._8_4_ = 0xffffffff;
      auVar72._0_8_ = 0xffffffffffffffff;
      auVar72._12_4_ = 0xffffffff;
      auVar72 = (auVar54 | in_XMM11) ^ auVar72;
      auVar54 = packssdw(auVar72,auVar72);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._14_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)local_10e8 + lVar48 + -0x1740) = 2;
      }
      lVar52 = (long)DAT_00c0d0e0;
      lVar77 = auVar90._8_8_;
      auVar90._0_8_ = auVar90._0_8_ + lVar52;
      lVar74 = DAT_00c0d0e0._8_8_;
      auVar90._8_8_ = lVar77 + lVar74;
      lVar77 = auVar88._8_8_;
      auVar88._0_8_ = auVar88._0_8_ + lVar52;
      auVar88._8_8_ = lVar77 + lVar74;
      lVar77 = auVar86._8_8_;
      auVar86._0_8_ = auVar86._0_8_ + lVar52;
      auVar86._8_8_ = lVar77 + lVar74;
      lVar77 = auVar84._8_8_;
      auVar84._0_8_ = auVar84._0_8_ + lVar52;
      auVar84._8_8_ = lVar77 + lVar74;
      lVar77 = auVar82._8_8_;
      auVar82._0_8_ = auVar82._0_8_ + lVar52;
      auVar82._8_8_ = lVar77 + lVar74;
      lVar77 = auVar80._8_8_;
      auVar80._0_8_ = auVar80._0_8_ + lVar52;
      auVar80._8_8_ = lVar77 + lVar74;
      lVar77 = auVar78._8_8_;
      auVar78._0_8_ = auVar78._0_8_ + lVar52;
      auVar78._8_8_ = lVar77 + lVar74;
      lVar77 = auVar76._8_8_;
      auVar76._0_8_ = auVar76._0_8_ + lVar52;
      auVar76._8_8_ = lVar77 + lVar74;
      lVar48 = lVar48 + 0x780;
      auVar54 = _DAT_00c0d0e0;
    } while ((ulong)(local_2f78.num_layers + 0xfU >> 4) * 0x780 - lVar48 != 0);
  }
  anon_unknown.dwarf_68a17e::CNNTest::RunCNNTest
            (0x10,0x10,local_10e8,local_2fe8,&local_2f78,0x10,&local_3018,0.0);
  return;
}

Assistant:

TEST_F(CNNTest, TestMultilayerConvolution) {
  int image_height = 16;
  int image_width = 16;
  int filter_height = 5;
  int filter_width = 4;

  float input[] = {
    -3, 1,  -3, 2,  -2, -2, 2,  -2, 1,  -2, -3, 1,  2,  2,  2,  -2, 0,  1,  -1,
    -3, -1, -1, 1,  0,  -3, 1,  0,  -1, 1,  0,  0,  -3, -3, -3, 0,  2,  1,  -1,
    2,  0,  1,  -3, -1, 2,  2,  1,  -2, 0,  -1, 0,  -2, -2, -1, 1,  0,  0,  0,
    -2, -2, -2, 1,  1,  -2, 1,  1,  -2, -2, 1,  -2, -1, -2, -3, 2,  -3, -1, 1,
    0,  -2, -2, -2, 1,  -2, -2, -1, -1, 2,  2,  2,  -1, 1,  -3, -3, 0,  2,  0,
    2,  1,  -3, -3, 1,  2,  2,  1,  -2, -3, 0,  -3, 0,  -3, -2, 0,  1,  1,  0,
    -3, 2,  -1, 2,  1,  0,  1,  -2, 1,  -1, -1, 2,  0,  -2, -3, 1,  1,  -2, -1,
    -3, -3, -1, 0,  -3, -2, 0,  0,  1,  0,  -3, -2, -1, 1,  0,  2,  1,  0,  -3,
    -2, -3, -3, -1, 0,  -2, 2,  -1, -3, 0,  -1, -1, 2,  0,  -3, -2, -1, 0,  0,
    1,  -2, 1,  2,  1,  2,  2,  -3, 2,  -1, 0,  0,  -1, 0,  2,  2,  -1, 2,  -2,
    1,  1,  -3, -3, 1,  -1, -1, -2, 2,  -2, -2, 2,  -1, -3, 2,  -3, 1,  -1, -1,
    -3, 1,  -1, 1,  0,  -3, -3, 1,  -3, -3, 0,  2,  2,  -2, -1, 2,  0,  2,  1,
    -1, -3, 0,  0,  -1, -1, 1,  0,  2,  0,  -3, 2,  1,  0,  1,  -3, 2,  -3, -3,
    -1, -3, -3, 2,  0,  2,  -2, 1,  -1,
  };

  float weights[] = {
    -2, 2,  -2, 2,  -1, -3, 2,  2,  0,  0,  -3, -1, -2, -3, 1,  -1, 0,  0,  0,
    2,  -2, 2,  -2, -3, 1,  1,  1,  -3, -1, 0,  1,  2,  -2, 0,  -1, -3, -1, -2,
    2,  -3, -3, 1,  -2, -3, 0,  2,  1,  -3, -3, -1, -3, -2, -1, -3, -1, -3, -2,
    -1, -3, -1, -2, -2, -3, 2,  0,  -3, 0,  -3, -3, 1,  -3, -1, 0,  -1, 1,  1,
    -1, 1,  -2, 0,  2,  0,  -3, 1,  -1, -1, 2,  0,  1,  -3, -3, 1,  2,  -3, -3,
    1,  -3, 2,  0,  -3, 1,  2,  2,  -2, -1, -2, 1,  1,  0,  -2, -2, 1,  2,  -1,
    -3, 1,  -2, 2,  -3, -2, -3, 2,  1,  0,  -2, 0,  1,  -3, 2,  -2, -2, 0,  2,
    -3, 2,  0,  0,  1,  -2, 1,  1,  -2, -1, -2, 1,  -2, 0,  -2, -2, 0,  -1, -1,
    -3, -3, -3, 1,  -3, -2, 2,  -1, 2,  0,  2,  -2, 2,  -2, 1,  -3, -3, -1, 0,
    2,  2,  1,  -1, -3, -1, -3, 2,  1,  -2, 0,  -3, -1, -3, -1, 2,  1,  0,  2,
    -1, 1,  0,  1,  2,  -1, -2, 2,  1,  -3, -1, -3, 0,  1,  -2, 0,  -2, -3, 0,
    -2, 2,  2,  0,  0,  2,  -3, 2,  -3, -2, 1,  2,  -3, -3, -1, -3, 0,  -3, -3,
    -2, -2, -2, 0,  0,  1,  0,  0,  -1, 0,  0,  -3, 0,  -3, -1, -2, 1,  -2, -1,
    2,  -2, 0,  0,  1,  0,  -2, -1, 0,  -3, 1,  0,  -1, -3, 1,  -1, 1,  -1, -3,
    1,  0,  1,  1,  -1, 2,  2,  0,  0,  1,  -3, 2,  -2, -2, -3, -2, -1, -2, 2,
    0,  2,  -2, -3, -1, -3, 2,  2,  -1, 2,  2,  -1, 0,  -3, 1,
  };

  float bias[] = {
    1, -1, 0, 1, 1, 1, -2,
  };

  float expected_same[] = {
    -1125, 2926,  6406,  631,   -1244, 97,    -1454, 2526,  1065,  3292,  3464,
    2553,  -330,  532,   1038,  1182,  -402,  3758,  3392,  9854,  4365,  1408,
    4736,  3134,  3838,  2409,  3221,  4350,  6750,  4045,  815,   1188,  2959,
    9802,  9590,  4572,  5740,  4253,  1701,  7974,  7012,  6854,  7093,  3907,
    4539,  3886,  4267,  3505,  465,   7824,  9219,  10026, 7968,  957,   2295,
    5594,  10811, 9641,  5950,  10043, 8783,  3132,  1421,  1110,  4108,  13929,
    10660, -84,   -61,   3932,  -180,  6811,  13393, 15147, 15640, 9337,  6961,
    3808,  1604,  1398,  1047,  6739,  10144, 6517,  4698,  2678,  7389,  2595,
    5248,  12075, 11272, 13951, 8820,  1090,  2199,  2206,  2788,  12116, 6683,
    2612,  -291,  3183,  9414,  12316, 14524, 12333, 13208, 7832,  4664,  4657,
    3534,  1298,  -666,  4250,  7707,  9103,  5760,  688,   9571,  15782, 14203,
    14878, 17339, 14684, 8690,  5671,  875,   1429,  1531,  6173,  2984,  5558,
    2996,  7928,  6733,  16117, 15262, 12757, 7980,  3923,  4795,  5973,  2051,
    455,   -1922, 1816,  5906,  3321,  10908, 10910, 7377,  12204, 12809, 11195,
    7451,  6666,  74,    -1645, -35,   -391,  3813,  7324,  892,   1656,  6095,
    12193, 14648, 12156, 14663, 10251, 10325, 7821,  3925,  323,   697,   442,
    1324,  4669,  7002,  5485,  5171,  5086,  10582, 11053, 9709,  11353, 8543,
    5256,  2873,  235,   -628,  1496,  1878,  -867,  3420,  6865,  5937,  10182,
    13277, 10069, 10789, 5998,  624,   -2082, 4417,  1258,  -1080, -819,  -1430,
    1033,  5220,  6335,  8471,  8980,  11908, 14430, 12584, 8404,  1576,  -803,
    985,   1481,  1367,  -193,  873,   3684,  2288,  6676,  9477,  11155, 9602,
    9707,  10507, 4739,  3174,  -575,  -178,  3002,  1710,  423,   -477,  554,
    3088,  2029,  5113,  5000,  3771,  6090,  5365,  1185,  2855,  399,   -312,
    -1577, 176,   955,
  };

  float expected_replicate[] = {
    13768, 13528, 12999, 6906,  4618,  4043,  2611,  9955,  6685,  4776,  2753,
    1036,  3063,  4544,  5183,  7349,  12451, 12501, 9131,  12753, 8908,  4058,
    6299,  7542,  7115,  3307,  3360,  3543,  9754,  7808,  5991,  9019,  14320,
    14919, 12492, 6871,  7373,  3336,  2085,  10604, 9377,  6882,  5009,  3103,
    6220,  6278,  7588,  10196, 11045, 11563, 11842, 11911, 8279,  2030,  1858,
    6368,  12123, 9909,  6347,  10345, 9365,  4038,  1673,  3051,  16492, 16649,
    12276, 408,   -301,  4122,  -654,  7864,  14038, 15279, 15315, 9744,  8243,
    5298,  746,   380,   9824,  9124,  10895, 6640,  4712,  2669,  6980,  2759,
    5385,  12345, 11336, 13129, 8600,  2370,  3682,  5219,  12407, 13123, 6784,
    2612,  -291,  3183,  9414,  12316, 14524, 12333, 13397, 7543,  3916,  4153,
    4477,  4314,  7983,  8418,  9163,  9103,  5760,  688,   9571,  15782, 14203,
    14878, 17718, 14570, 7940,  6642,  5094,  7133,  9964,  10219, 3224,  5558,
    2996,  7928,  6733,  16117, 15262, 12757, 7958,  4401,  5187,  5476,  5529,
    6055,  2206,  3909,  6015,  3321,  10908, 10910, 7377,  12204, 12809, 11195,
    6967,  6840,  481,   -1600, 274,   1,     10373, 8514,  1123,  2117,  6758,
    12736, 16223, 13585, 15988, 11771, 10600, 7918,  4156,  2840,  3111,  3287,
    6359,  7652,  8813,  6530,  6967,  7789,  13671, 13990, 13247, 13241, 9836,
    5251,  3024,  2313,  1834,  4187,  2637,  -1312, 2139,  7378,  7665,  11933,
    15591, 15314, 15678, 9531,  2820,  -1516, 3400,  1314,  22,    363,   -2896,
    -898,  5906,  7308,  10650, 12975, 16978, 20370, 18817, 12381, 4118,  -861,
    -137,  236,   1802,  1632,  -350,  2334,  3400,  8680,  14064, 18216, 18675,
    21765, 22871, 11491, 4937,  -1555, -11,   1669,  2392,  3265,  -5254, -217,
    5001,  8063,  13444, 18884, 19706, 22794, 21064, 9545,  6689,  -7,    289,
    -2021, 504,   2347,
  };

  float expected_valid[] = {
    2612,  -291,  3183,  9414,  12316, 14524, 12333, 9103,  5760,  688,
    9571,  15782, 14203, 14878, 5558,  2996,  7928,  6733,  16117, 15262,
    12757, 3321,  10908, 10910, 7377,  12204, 12809, 11195,
  };

  CNN_CONFIG cnn_config = { 3,
                            0,
                            0,
                            0,
                            0,
                            {
                                {
                                    1,
                                    filter_width,
                                    filter_height,
                                    3,
                                    1,
                                    1,
                                    0,
                                    nullptr,
                                    nullptr,
                                    PADDING_SAME_ZERO,
                                    NONE,
                                    0,
                                    0,
                                    BRANCH_NO_COPY,
                                    BRANCH_NOC,
                                    {},
                                    {},
                                    -1,
                                },
                                {
                                    3,
                                    filter_width,
                                    filter_height,
                                    3,
                                    1,
                                    1,
                                    0,
                                    nullptr,
                                    nullptr,
                                    PADDING_SAME_ZERO,
                                    NONE,
                                    0,
                                    0,
                                    BRANCH_NO_COPY,
                                    BRANCH_NOC,
                                    {},
                                    {},
                                    -1,
                                },
                                {
                                    3,
                                    filter_width,
                                    filter_height,
                                    1,
                                    1,
                                    1,
                                    0,
                                    nullptr,
                                    nullptr,
                                    PADDING_SAME_ZERO,
                                    NONE,
                                    0,
                                    0,
                                    BRANCH_NO_COPY,
                                    BRANCH_NOC,
                                    {},
                                    {},
                                    0,
                                },
                            } };

  // Weights and biases need to be specified separately because
  // of the offset.
  AssignLayerWeightsBiases(&cnn_config, weights, bias);

  CNN_THREAD_DATA thread_data = { 1, nullptr };

  RunCNNTest(image_width, image_height, input, expected_same, &cnn_config,
             image_width, &thread_data, MSE_INT_TOL);

  for (int i = 0; i < cnn_config.num_layers; ++i) {
    cnn_config.layer_config[i].pad = PADDING_SAME_REPLICATE;
  }

  RunCNNTest(image_width, image_height, input, expected_replicate, &cnn_config,
             image_width, &thread_data, MSE_INT_TOL);

  for (int i = 0; i < cnn_config.num_layers; ++i) {
    cnn_config.layer_config[i].pad = PADDING_VALID;
  }

  RunCNNTest(image_width, image_height, input, expected_valid, &cnn_config,
             image_width, &thread_data, MSE_INT_TOL);
}